

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::maxArraySize
          (ShaderStorageBufferLayoutBindingCase *this)

{
  int iVar1;
  Functions *pFVar2;
  GLint local_14;
  ShaderStorageBufferLayoutBindingCase *pSStack_10;
  int units;
  ShaderStorageBufferLayoutBindingCase *this_local;
  
  local_14 = 0;
  pSStack_10 = this;
  iVar1 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x14])();
  if (iVar1 == 0) {
    pFVar2 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
    (*pFVar2->getIntegerv)(0x90d6,&local_14);
  }
  else if (iVar1 == 1) {
    pFVar2 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
    (*pFVar2->getIntegerv)(0x90da,&local_14);
  }
  else if (iVar1 == 2) {
    pFVar2 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
    (*pFVar2->getIntegerv)(0x90db,&local_14);
  }
  return local_14;
}

Assistant:

int maxArraySize()
	{
		int units = 0;
		switch (getStage())
		{
		case FragmentShader:
			gl().getIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &units);
			break;
		case VertexShader:
			gl().getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &units);
			break;
		case ComputeShader:
			gl().getIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &units);
			break;
		default:
			DE_ASSERT(0);
			break;
		}
		return units;
	}